

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

void __thiscall Mat::reoeder(Mat *this)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  pointer p_Var4;
  pointer p_Var5;
  ulong uVar6;
  pointer p_Var7;
  long lVar8;
  vector<__int128,_std::allocator<__int128>_> v;
  allocator_type local_29;
  vector<__int128,_std::allocator<__int128>_> local_28;
  
  std::vector<__int128,_std::allocator<__int128>_>::vector
            (&local_28,(long)this->c * (long)this->r,&local_29);
  uVar1 = this->r;
  if (this->order == 1) {
    uVar1 = this->c;
  }
  if (0 < (int)uVar1) {
    uVar2 = this->c;
    if (this->order == 1) {
      uVar2 = this->r;
    }
    p_Var4 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    p_Var5 = local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (0 < (int)uVar2) {
        lVar8 = 0;
        p_Var7 = p_Var4;
        do {
          uVar3 = *(undefined8 *)((long)p_Var7 + 8);
          *(undefined8 *)((long)p_Var5 + lVar8) = (long)*p_Var7;
          ((undefined8 *)((long)p_Var5 + lVar8))[1] = uVar3;
          lVar8 = lVar8 + 0x10;
          p_Var7 = p_Var7 + uVar1;
        } while ((ulong)uVar2 * 0x10 != lVar8);
      }
      uVar6 = uVar6 + 1;
      p_Var5 = p_Var5 + uVar2;
      p_Var4 = p_Var4 + 1;
    } while (uVar6 != uVar1);
  }
  std::vector<__int128,std::allocator<__int128>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<__int128*,std::vector<__int128,std::allocator<__int128>>>>
            ((vector<__int128,std::allocator<__int128>> *)&this->val,
             local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_finish);
  *(byte *)&this->order = (byte)this->order ^ 1;
  if (local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Mat::reoeder() {
    vector<ll128> v(r * c);
    int tmp_r = r;
    int tmp_c = c;
    if (order == MatRowMajor) {
        swap(tmp_r, tmp_c);
    }
    for (int i = 0; i < tmp_r; i++) {
        for (int j = 0; j < tmp_c; j++) {
            v[i * tmp_c + j] = val[j * tmp_r + i];
        }
    }
    val.assign(v.begin(), v.end());
    order ^= 1;
}